

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

OutputFile * __thiscall re2c::OutputFile::wc(OutputFile *this,char c)

{
  char local_9;
  
  local_9 = c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &((this->blocks).
               super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]->fragments).
              super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1]->stream,&local_9,1);
  return this;
}

Assistant:

OutputFile & OutputFile::wc (char c)
{
	stream () << c;
	return *this;
}